

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

Value * duckdb::Value::TIMESTAMPSEC(Value *__return_storage_ptr__,timestamp_sec_t timestamp)

{
  LogicalType local_30;
  
  LogicalType::LogicalType(&local_30,TIMESTAMP_SEC);
  Value(__return_storage_ptr__,&local_30);
  LogicalType::~LogicalType(&local_30);
  (__return_storage_ptr__->value_).timestamp_s.super_timestamp_t.value =
       (int64_t)timestamp.super_timestamp_t.value;
  __return_storage_ptr__->is_null = false;
  return __return_storage_ptr__;
}

Assistant:

Value Value::TIMESTAMPSEC(timestamp_sec_t timestamp) {
	Value result(LogicalType::TIMESTAMP_S);
	result.value_.timestamp_s = timestamp;
	result.is_null = false;
	return result;
}